

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void av1_lowbd_inv_txfm2d_add_v_identity_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  long lVar1;
  ulong uVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  char *pcVar6;
  transform_1d_ssse3 p_Var7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  longlong lVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  long lVar36;
  __m128i *palVar37;
  undefined8 *puVar38;
  int iVar39;
  uint uVar40;
  ulong uVar41;
  uint uVar42;
  ulong uVar43;
  __m128i *palVar44;
  ulong *puVar45;
  int iVar46;
  undefined7 in_register_00000081;
  uint uVar47;
  undefined4 uVar48;
  undefined1 auVar50 [12];
  __m128i alVar51;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined4 uVar59;
  undefined1 auVar61 [12];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined4 uVar89;
  undefined1 auVar91 [12];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined4 uVar107;
  undefined1 auVar109 [12];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  __m128i temp [8];
  __m128i buf1 [64];
  __m128i buf0 [64];
  int local_908;
  ulong local_8c8;
  undefined1 (*local_8c0 [3]) [16];
  undefined2 local_8a8;
  undefined2 uStack_8a6;
  undefined2 uStack_8a4;
  undefined2 uStack_8a2;
  undefined2 uStack_8a0;
  undefined2 uStack_89e;
  undefined2 uStack_89c;
  undefined2 uStack_89a;
  undefined1 local_898 [16];
  undefined2 local_888;
  undefined2 uStack_886;
  undefined2 uStack_884;
  undefined2 uStack_882;
  undefined2 uStack_880;
  undefined2 uStack_87e;
  undefined2 uStack_87c;
  undefined2 uStack_87a;
  undefined1 local_878 [16];
  undefined2 local_868;
  undefined2 uStack_866;
  undefined2 uStack_864;
  undefined2 uStack_862;
  undefined2 uStack_860;
  undefined2 uStack_85e;
  undefined2 uStack_85c;
  undefined2 uStack_85a;
  undefined1 local_858 [16];
  undefined2 local_848;
  undefined2 uStack_846;
  undefined2 uStack_844;
  undefined2 uStack_842;
  undefined2 uStack_840;
  undefined2 uStack_83e;
  undefined2 uStack_83c;
  undefined2 uStack_83a;
  undefined8 local_838 [4];
  undefined8 uStack_818;
  undefined4 auStack_810 [6];
  undefined8 uStack_7f8;
  undefined8 auStack_7f0 [3];
  undefined8 uStack_7d8;
  undefined4 auStack_7d0 [230];
  longlong local_438 [2];
  undefined2 auStack_428 [8];
  undefined1 auStack_418 [16];
  undefined2 auStack_408 [8];
  undefined1 auStack_3f8 [16];
  undefined2 auStack_3e8 [8];
  undefined1 auStack_3d8 [16];
  undefined2 auStack_3c8 [460];
  undefined1 auVar49 [12];
  undefined1 auVar56 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar52 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [12];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar84 [16];
  undefined1 auVar83 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar85 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [12];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [12];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  
  uVar34 = CONCAT71(in_register_00000081,tx_size) & 0xffffffff;
  uVar42 = tx_size_high[uVar34];
  uVar47 = 0x20;
  if ((int)uVar42 < 0x20) {
    uVar47 = uVar42;
  }
  if (eob < (int)uVar47) {
    iVar39 = eob_fill[eob + -1];
  }
  else {
    iVar39 = uVar47 - 1;
  }
  uVar43 = (ulong)(uint)((int)CONCAT71(in_register_00000081,tx_size) * 4);
  uVar5 = *(uint *)((long)tx_size_wide + uVar43);
  uVar40 = iVar39 + 8 >> 3;
  local_908 = 0;
  if (uVar5 != uVar42) {
    if ((int)uVar42 < (int)uVar5) {
      local_908 = 1;
      if ((uVar42 * 2 == uVar5) || (local_908 = 2, uVar42 << 2 == uVar5)) goto LAB_003d1508;
    }
    else {
      local_908 = -1;
      if ((uVar5 * 2 == uVar42) || (local_908 = -2, uVar5 * 4 == uVar42)) goto LAB_003d1508;
    }
    local_908 = 0;
  }
LAB_003d1508:
  if (0 < (int)uVar40) {
    pcVar6 = av1_inv_txfm_shift_ls[uVar34];
    iVar39 = *(int *)((long)tx_size_high_log2 + uVar43);
    uVar42 = (int)uVar5 >> 3;
    p_Var7 = lowbd_txfm_all_1d_zeros_w8_arr[(long)*(int *)((long)tx_size_wide_log2 + uVar43) + -2]
             [""[tx_type]][lowbd_txfm_all_1d_zeros_idx[eob_fill[(eob + -1) / (int)uVar47]]];
    uVar34 = (ulong)((eob_fill[(eob + -1) / (int)uVar47] & 0xfffffff8U) + 8);
    uVar43 = (ulong)uVar42;
    local_8c0[0] = (undefined1 (*) [16])(input + 4);
    local_8c8 = 0;
    do {
      lVar1 = local_8c8 * 8;
      pauVar35 = local_8c0[0];
      palVar37 = &local_438;
      uVar41 = uVar34;
      do {
        alVar51 = (__m128i)packssdw(pauVar35[-1],*pauVar35);
        *palVar37 = alVar51;
        palVar37 = palVar37 + 1;
        pauVar35 = (undefined1 (*) [16])(*pauVar35 + (long)(int)uVar47 * 4);
        uVar41 = uVar41 - 1;
      } while (uVar41 != 0);
      palVar37 = &local_438;
      uVar41 = uVar34;
      if ((local_908 == 1) || (local_908 == -1)) {
        do {
          alVar51 = (__m128i)pmulhrsw((undefined1  [16])*palVar37,_DAT_0055f7f0);
          *palVar37 = alVar51;
          uVar41 = uVar41 - 1;
          palVar37 = palVar37 + 1;
        } while (uVar41 != 0);
      }
      (*p_Var7)(&local_438,&local_438);
      cVar3 = *pcVar6;
      if (cVar3 < 0) {
        auVar53 = ZEXT416((uint)(1 << (cVar3 + 0xfU & 0x1f)));
        auVar53 = pshuflw(auVar53,auVar53,0);
        auVar53._4_4_ = auVar53._0_4_;
        auVar53._8_4_ = auVar53._0_4_;
        auVar53._12_4_ = auVar53._0_4_;
        palVar37 = &local_438;
        uVar41 = (ulong)uVar5;
        do {
          alVar51 = (__m128i)pmulhrsw((undefined1  [16])*palVar37,auVar53);
          *palVar37 = alVar51;
          palVar37 = palVar37 + 1;
          uVar41 = uVar41 - 1;
        } while (uVar41 != 0);
      }
      else {
        palVar37 = &local_438;
        uVar41 = (ulong)uVar5;
        if (cVar3 != '\0') {
          do {
            alVar51 = (__m128i)psllw((undefined1  [16])*palVar37,ZEXT416((uint)(int)cVar3));
            *palVar37 = alVar51;
            uVar41 = uVar41 - 1;
            palVar37 = palVar37 + 1;
          } while (uVar41 != 0);
        }
      }
      if (tx_type < 0x10 && (0x7f1fU >> (tx_type & 0x1f) & 1) == 0) {
        if (0 < (int)uVar42) {
          uVar41 = 0;
          palVar37 = &local_438;
          do {
            lVar36 = 0x80;
            palVar44 = palVar37;
            do {
              lVar22 = (*palVar44)[1];
              *(longlong *)((long)local_8c0 + lVar36 + -8) = (*palVar44)[0];
              *(longlong *)((long)local_8c0 + lVar36) = lVar22;
              palVar44 = palVar44 + 1;
              lVar36 = lVar36 + -0x10;
            } while (lVar36 != 0);
            lVar36 = ~uVar41 + uVar43;
            auVar70._0_12_ = local_8c0._8_12_;
            auVar70._12_2_ = local_8c0[1]._6_2_;
            auVar70._14_2_ = uStack_8a2;
            auVar69._12_4_ = auVar70._12_4_;
            auVar69._0_10_ = local_8c0._8_10_;
            auVar69._10_2_ = uStack_8a4;
            auVar68._10_6_ = auVar69._10_6_;
            auVar68._0_8_ = local_8c0[1];
            auVar68._8_2_ = local_8c0[1]._4_2_;
            auVar27._4_8_ = auVar68._8_8_;
            auVar27._2_2_ = uStack_8a6;
            auVar27._0_2_ = local_8c0[1]._2_2_;
            auVar67._0_4_ = CONCAT22(local_8a8,(short)local_8c0[1]);
            auVar67._4_12_ = auVar27;
            auVar104._0_12_ = local_898._0_12_;
            auVar104._12_2_ = local_898._6_2_;
            auVar104._14_2_ = uStack_882;
            auVar103._12_4_ = auVar104._12_4_;
            auVar103._0_10_ = local_898._0_10_;
            auVar103._10_2_ = uStack_884;
            auVar102._10_6_ = auVar103._10_6_;
            auVar102._0_8_ = local_898._0_8_;
            auVar102._8_2_ = local_898._4_2_;
            auVar28._4_8_ = auVar102._8_8_;
            auVar28._2_2_ = uStack_886;
            auVar28._0_2_ = local_898._2_2_;
            auVar81._0_12_ = local_878._0_12_;
            auVar81._12_2_ = local_878._6_2_;
            auVar81._14_2_ = uStack_862;
            auVar80._12_4_ = auVar81._12_4_;
            auVar80._0_10_ = local_878._0_10_;
            auVar80._10_2_ = uStack_864;
            auVar79._10_6_ = auVar80._10_6_;
            auVar79._0_8_ = local_878._0_8_;
            auVar79._8_2_ = local_878._4_2_;
            auVar29._4_8_ = auVar79._8_8_;
            auVar29._2_2_ = uStack_866;
            auVar29._0_2_ = local_878._2_2_;
            auVar78._0_4_ = CONCAT22(local_868,local_878._0_2_);
            auVar78._4_12_ = auVar29;
            auVar119._0_12_ = local_858._0_12_;
            auVar119._12_2_ = local_858._6_2_;
            auVar119._14_2_ = uStack_842;
            auVar118._12_4_ = auVar119._12_4_;
            auVar118._0_10_ = local_858._0_10_;
            auVar118._10_2_ = uStack_844;
            auVar117._10_6_ = auVar118._10_6_;
            auVar117._0_8_ = local_858._0_8_;
            auVar117._8_2_ = local_858._4_2_;
            auVar30._4_8_ = auVar117._8_8_;
            auVar30._2_2_ = uStack_846;
            auVar30._0_2_ = local_858._2_2_;
            uVar48 = CONCAT22(uStack_8a0,(short)local_8c0[2]);
            auVar50._0_8_ = CONCAT26(uStack_89e,CONCAT24(local_8c0[2]._2_2_,uVar48));
            auVar50._8_2_ = local_8c0[2]._4_2_;
            auVar50._10_2_ = uStack_89c;
            auVar87._12_2_ = local_8c0[2]._6_2_;
            auVar87._0_12_ = auVar50;
            auVar87._14_2_ = uStack_89a;
            uVar89 = CONCAT22(uStack_880,local_898._8_2_);
            auVar91._0_8_ = CONCAT26(uStack_87e,CONCAT24(local_898._10_2_,uVar89));
            auVar91._8_2_ = local_898._12_2_;
            auVar91._10_2_ = uStack_87c;
            auVar93._12_2_ = local_898._14_2_;
            auVar93._0_12_ = auVar91;
            auVar93._14_2_ = uStack_87a;
            uVar59 = CONCAT22(uStack_860,local_878._8_2_);
            auVar61._0_8_ = CONCAT26(uStack_85e,CONCAT24(local_878._10_2_,uVar59));
            auVar61._8_2_ = local_878._12_2_;
            auVar61._10_2_ = uStack_85c;
            auVar94._12_2_ = local_878._14_2_;
            auVar94._0_12_ = auVar61;
            auVar94._14_2_ = uStack_85a;
            uVar107 = CONCAT22(uStack_840,local_858._8_2_);
            auVar109._0_8_ = CONCAT26(uStack_83e,CONCAT24(local_858._10_2_,uVar107));
            auVar109._8_2_ = local_858._12_2_;
            auVar109._10_2_ = uStack_83c;
            auVar111._12_2_ = local_858._14_2_;
            auVar111._0_12_ = auVar109;
            auVar111._14_2_ = uStack_83a;
            auVar96._0_8_ = auVar67._0_8_;
            auVar96._8_4_ = auVar27._0_4_;
            auVar96._12_4_ = auVar28._0_4_;
            auVar98._0_8_ = auVar78._0_8_;
            auVar98._8_4_ = auVar29._0_4_;
            auVar98._12_4_ = auVar30._0_4_;
            auVar106._8_4_ = (int)((ulong)auVar50._0_8_ >> 0x20);
            auVar106._0_8_ = auVar50._0_8_;
            auVar106._12_4_ = (int)((ulong)auVar91._0_8_ >> 0x20);
            auVar113._8_4_ = (int)((ulong)auVar61._0_8_ >> 0x20);
            auVar113._0_8_ = auVar61._0_8_;
            auVar113._12_4_ = (int)((ulong)auVar109._0_8_ >> 0x20);
            local_838[lVar36 * 0x10] = CONCAT44(CONCAT22(local_888,local_898._0_2_),auVar67._0_4_);
            local_838[lVar36 * 0x10 + 1] =
                 CONCAT44(CONCAT22(local_848,local_858._0_2_),auVar78._0_4_);
            local_838[lVar36 * 0x10 + 2] = auVar96._8_8_;
            (&uStack_818)[lVar36 * 0x10 + -1] = auVar98._8_8_;
            *(int *)(&uStack_818 + lVar36 * 0x10) = auVar68._8_4_;
            *(int *)((long)&uStack_818 + (lVar36 * 0x20 + 1) * 4) = auVar102._8_4_;
            *(int *)(&uStack_818 + lVar36 * 0x10 + 1) = auVar79._8_4_;
            *(int *)((long)&uStack_818 + (lVar36 * 0x20 + 3) * 4) = auVar117._8_4_;
            *(undefined4 *)(&uStack_818 + lVar36 * 0x10 + 3) = auVar69._12_4_;
            *(undefined4 *)((long)&uStack_818 + (lVar36 * 0x20 + 7) * 4) = auVar103._12_4_;
            *(undefined4 *)(&uStack_7f8 + lVar36 * 0x10) = auVar80._12_4_;
            *(undefined4 *)((long)auStack_7f0 + lVar36 * 0x80 + -4) = auVar118._12_4_;
            (&uStack_7f8)[lVar36 * 0x10] = CONCAT44(uVar89,uVar48);
            auStack_7f0[lVar36 * 0x10] = CONCAT44(uVar107,uVar59);
            auStack_7f0[lVar36 * 0x10 + 1] = auVar106._8_8_;
            (&uStack_7d8)[lVar36 * 0x10 + -1] = auVar113._8_8_;
            *(int *)(&uStack_7d8 + lVar36 * 0x10) = auVar50._8_4_;
            *(int *)((long)&uStack_7d8 + (lVar36 * 0x20 + 1) * 4) = auVar91._8_4_;
            *(int *)(&uStack_7d8 + lVar36 * 0x10 + 1) = auVar61._8_4_;
            *(int *)((long)&uStack_7d8 + (lVar36 * 0x20 + 3) * 4) = auVar109._8_4_;
            *(int *)(&uStack_7d8 + lVar36 * 0x10 + 3) = auVar87._12_4_;
            *(int *)((long)&uStack_7d8 + (lVar36 * 0x20 + 7) * 4) = auVar93._12_4_;
            *(int *)(&uStack_7d8 + lVar36 * 0x10 + 4) = auVar94._12_4_;
            *(int *)((long)&uStack_7d8 + (lVar36 * 0x20 + 9) * 4) = auVar111._12_4_;
            uVar41 = uVar41 + 1;
            palVar37 = palVar37 + 8;
          } while (uVar41 != uVar43);
          goto LAB_003d19a7;
        }
      }
      else if (0 < (int)uVar42) {
        lVar36 = 0;
        do {
          auVar53 = *(undefined1 (*) [16])((long)local_438 + lVar36);
          auVar87 = *(undefined1 (*) [16])((long)auStack_428 + lVar36 + 0x10);
          auVar66._0_12_ = auVar53._0_12_;
          auVar66._12_2_ = auVar53._6_2_;
          auVar66._14_2_ = *(undefined2 *)((long)auStack_428 + lVar36 + 6);
          auVar65._12_4_ = auVar66._12_4_;
          auVar65._0_10_ = auVar53._0_10_;
          auVar65._10_2_ = *(undefined2 *)((long)auStack_428 + lVar36 + 4);
          auVar64._10_6_ = auVar65._10_6_;
          auVar64._0_8_ = auVar53._0_8_;
          auVar64._8_2_ = auVar53._4_2_;
          auVar23._4_8_ = auVar64._8_8_;
          auVar23._2_2_ = *(undefined2 *)((long)auStack_428 + lVar36 + 2);
          auVar23._0_2_ = auVar53._2_2_;
          auVar63._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_428 + lVar36),auVar53._0_2_);
          auVar63._4_12_ = auVar23;
          auVar101._0_12_ = auVar87._0_12_;
          auVar101._12_2_ = auVar87._6_2_;
          auVar101._14_2_ = *(undefined2 *)((long)auStack_408 + lVar36 + 6);
          auVar100._12_4_ = auVar101._12_4_;
          auVar100._0_10_ = auVar87._0_10_;
          auVar100._10_2_ = *(undefined2 *)((long)auStack_408 + lVar36 + 4);
          auVar99._10_6_ = auVar100._10_6_;
          auVar99._0_8_ = auVar87._0_8_;
          auVar99._8_2_ = auVar87._4_2_;
          auVar24._4_8_ = auVar99._8_8_;
          auVar24._2_2_ = *(undefined2 *)((long)auStack_408 + lVar36 + 2);
          auVar24._0_2_ = auVar87._2_2_;
          auVar94 = *(undefined1 (*) [16])((long)auStack_408 + lVar36 + 0x10);
          auVar77._0_12_ = auVar94._0_12_;
          auVar77._12_2_ = auVar94._6_2_;
          auVar77._14_2_ = *(undefined2 *)((long)auStack_3e8 + lVar36 + 6);
          auVar76._12_4_ = auVar77._12_4_;
          auVar76._0_10_ = auVar94._0_10_;
          auVar76._10_2_ = *(undefined2 *)((long)auStack_3e8 + lVar36 + 4);
          auVar75._10_6_ = auVar76._10_6_;
          auVar75._0_8_ = auVar94._0_8_;
          auVar75._8_2_ = auVar94._4_2_;
          auVar25._4_8_ = auVar75._8_8_;
          auVar25._2_2_ = *(undefined2 *)((long)auStack_3e8 + lVar36 + 2);
          auVar25._0_2_ = auVar94._2_2_;
          auVar74._0_4_ = CONCAT22(*(undefined2 *)((long)auStack_3e8 + lVar36),auVar94._0_2_);
          auVar74._4_12_ = auVar25;
          auVar70 = *(undefined1 (*) [16])((long)auStack_3e8 + lVar36 + 0x10);
          auVar116._0_12_ = auVar70._0_12_;
          auVar116._12_2_ = auVar70._6_2_;
          auVar116._14_2_ = *(undefined2 *)((long)auStack_3c8 + lVar36 + 6);
          auVar115._12_4_ = auVar116._12_4_;
          auVar115._0_10_ = auVar70._0_10_;
          auVar115._10_2_ = *(undefined2 *)((long)auStack_3c8 + lVar36 + 4);
          auVar114._10_6_ = auVar115._10_6_;
          auVar114._0_8_ = auVar70._0_8_;
          auVar114._8_2_ = auVar70._4_2_;
          auVar26._4_8_ = auVar114._8_8_;
          auVar26._2_2_ = *(undefined2 *)((long)auStack_3c8 + lVar36 + 2);
          auVar26._0_2_ = auVar70._2_2_;
          uVar48 = CONCAT22(*(undefined2 *)((long)auStack_428 + lVar36 + 8),auVar53._8_2_);
          auVar49._0_8_ =
               CONCAT26(*(undefined2 *)((long)auStack_428 + lVar36 + 10),
                        CONCAT24(auVar53._10_2_,uVar48));
          auVar49._8_2_ = auVar53._12_2_;
          auVar49._10_2_ = *(undefined2 *)((long)auStack_428 + lVar36 + 0xc);
          auVar52._12_2_ = auVar53._14_2_;
          auVar52._0_12_ = auVar49;
          auVar52._14_2_ = *(undefined2 *)((long)auStack_428 + lVar36 + 0xe);
          uVar89 = CONCAT22(*(undefined2 *)((long)auStack_408 + lVar36 + 8),auVar87._8_2_);
          auVar90._0_8_ =
               CONCAT26(*(undefined2 *)((long)auStack_408 + lVar36 + 10),
                        CONCAT24(auVar87._10_2_,uVar89));
          auVar90._8_2_ = auVar87._12_2_;
          auVar90._10_2_ = *(undefined2 *)((long)auStack_408 + lVar36 + 0xc);
          auVar92._12_2_ = auVar87._14_2_;
          auVar92._0_12_ = auVar90;
          auVar92._14_2_ = *(undefined2 *)((long)auStack_408 + lVar36 + 0xe);
          uVar59 = CONCAT22(*(undefined2 *)((long)auStack_3e8 + lVar36 + 8),auVar94._8_2_);
          auVar60._0_8_ =
               CONCAT26(*(undefined2 *)((long)auStack_3e8 + lVar36 + 10),
                        CONCAT24(auVar94._10_2_,uVar59));
          auVar60._8_2_ = auVar94._12_2_;
          auVar60._10_2_ = *(undefined2 *)((long)auStack_3e8 + lVar36 + 0xc);
          auVar62._12_2_ = auVar94._14_2_;
          auVar62._0_12_ = auVar60;
          auVar62._14_2_ = *(undefined2 *)((long)auStack_3e8 + lVar36 + 0xe);
          uVar107 = CONCAT22(*(undefined2 *)((long)auStack_3c8 + lVar36 + 8),auVar70._8_2_);
          auVar108._0_8_ =
               CONCAT26(*(undefined2 *)((long)auStack_3c8 + lVar36 + 10),
                        CONCAT24(auVar70._10_2_,uVar107));
          auVar108._8_2_ = auVar70._12_2_;
          auVar108._10_2_ = *(undefined2 *)((long)auStack_3c8 + lVar36 + 0xc);
          auVar110._12_2_ = auVar70._14_2_;
          auVar110._0_12_ = auVar108;
          auVar110._14_2_ = *(undefined2 *)((long)auStack_3c8 + lVar36 + 0xe);
          auVar95._0_8_ = auVar63._0_8_;
          auVar95._8_4_ = auVar23._0_4_;
          auVar95._12_4_ = auVar24._0_4_;
          auVar97._0_8_ = auVar74._0_8_;
          auVar97._8_4_ = auVar25._0_4_;
          auVar97._12_4_ = auVar26._0_4_;
          auVar105._8_4_ = (int)((ulong)auVar49._0_8_ >> 0x20);
          auVar105._0_8_ = auVar49._0_8_;
          auVar105._12_4_ = (int)((ulong)auVar90._0_8_ >> 0x20);
          auVar112._8_4_ = (int)((ulong)auVar60._0_8_ >> 0x20);
          auVar112._0_8_ = auVar60._0_8_;
          auVar112._12_4_ = (int)((ulong)auVar108._0_8_ >> 0x20);
          *(ulong *)((long)local_838 + lVar36) =
               CONCAT44(CONCAT22(*(undefined2 *)((long)auStack_408 + lVar36),auVar87._0_2_),
                        auVar63._0_4_);
          *(ulong *)((long)local_838 + lVar36 + 8) =
               CONCAT44(CONCAT22(*(undefined2 *)((long)auStack_3c8 + lVar36),auVar70._0_2_),
                        auVar74._0_4_);
          *(long *)((long)local_838 + lVar36 + 0x10) = auVar95._8_8_;
          *(long *)((long)local_838 + lVar36 + 0x18) = auVar97._8_8_;
          *(int *)((long)&uStack_818 + lVar36) = auVar64._8_4_;
          *(int *)((long)&uStack_818 + lVar36 + 4) = auVar99._8_4_;
          *(int *)((long)auStack_810 + lVar36) = auVar75._8_4_;
          *(int *)((long)auStack_810 + lVar36 + 4) = auVar114._8_4_;
          *(undefined4 *)((long)auStack_810 + lVar36 + 0x10) = auVar65._12_4_;
          *(undefined4 *)((long)auStack_810 + lVar36 + 0x14) = auVar100._12_4_;
          *(undefined4 *)((long)&uStack_7f8 + lVar36) = auVar76._12_4_;
          *(undefined4 *)((long)auStack_7f0 + lVar36 + -4) = auVar115._12_4_;
          *(ulong *)((long)&uStack_7f8 + lVar36) = CONCAT44(uVar89,uVar48);
          *(ulong *)((long)auStack_7f0 + lVar36) = CONCAT44(uVar107,uVar59);
          *(long *)((long)auStack_7f0 + lVar36 + 8) = auVar105._8_8_;
          *(long *)((long)auStack_7f0 + lVar36 + 0x10) = auVar112._8_8_;
          *(int *)((long)&uStack_7d8 + lVar36) = auVar49._8_4_;
          *(int *)((long)&uStack_7d8 + lVar36 + 4) = auVar90._8_4_;
          *(int *)((long)auStack_7d0 + lVar36) = auVar60._8_4_;
          *(int *)((long)auStack_7d0 + lVar36 + 4) = auVar108._8_4_;
          *(int *)((long)auStack_7d0 + lVar36 + 0x10) = auVar52._12_4_;
          *(int *)((long)auStack_7d0 + lVar36 + 0x14) = auVar92._12_4_;
          *(int *)((long)auStack_7d0 + lVar36 + 0x18) = auVar62._12_4_;
          *(int *)((long)auStack_7d0 + lVar36 + 0x1c) = auVar110._12_4_;
          lVar36 = lVar36 + 0x80;
        } while (uVar43 << 7 != lVar36);
LAB_003d19a7:
        if (0 < (int)uVar42) {
          auVar53 = pshuflw(ZEXT416((uint)tx_size_high_log2[(long)iVar39 + 0x12]),
                            ZEXT416((uint)tx_size_high_log2[(long)iVar39 + 0x12]),0);
          auVar58._0_12_ = auVar53._0_12_;
          auVar58._12_2_ = auVar53._6_2_;
          auVar58._14_2_ = 0x800;
          auVar57._12_4_ = auVar58._12_4_;
          auVar57._0_10_ = auVar53._0_10_;
          auVar57._10_2_ = 0x800;
          auVar56._10_6_ = auVar57._10_6_;
          auVar56._0_8_ = auVar53._0_8_;
          auVar56._8_2_ = auVar53._4_2_;
          auVar55._8_8_ = auVar56._8_8_;
          auVar55._0_8_ = 0x800000000000000;
          auVar54._6_10_ = auVar55._6_10_;
          auVar54._4_2_ = auVar53._2_2_;
          auVar54._0_2_ = auVar53._0_2_;
          auVar54._2_2_ = 0x800;
          puVar38 = local_838;
          uVar41 = 0;
          do {
            puVar45 = (ulong *)(output + uVar41 * 8 + lVar1 * stride);
            bVar4 = pcVar6[1];
            iVar46 = 1 << (~bVar4 & 0x1f);
            lVar36 = 0;
            do {
              auVar53 = *(undefined1 (*) [16])((long)puVar38 + lVar36);
              auVar86._0_12_ = auVar53._0_12_;
              auVar86._12_2_ = auVar53._6_2_;
              auVar86._14_2_ = 1;
              auVar85._12_4_ = auVar86._12_4_;
              auVar85._0_10_ = auVar53._0_10_;
              auVar85._10_2_ = 1;
              auVar84._10_6_ = auVar85._10_6_;
              auVar84._0_8_ = auVar53._0_8_;
              auVar84._8_2_ = auVar53._4_2_;
              auVar83._8_8_ = auVar84._8_8_;
              auVar83._0_8_ = 0x1000000000000;
              auVar82._6_10_ = auVar83._6_10_;
              auVar82._4_2_ = auVar53._2_2_;
              auVar82._0_2_ = auVar53._0_2_;
              auVar82._2_2_ = 1;
              auVar71._2_2_ = 0;
              auVar71._0_2_ = auVar53._8_2_;
              auVar71._4_2_ = auVar53._10_2_;
              auVar71._6_2_ = 0;
              auVar71._8_2_ = auVar53._12_2_;
              auVar71._10_2_ = 0;
              auVar71._12_2_ = auVar53._14_2_;
              auVar71._14_2_ = 1;
              auVar87 = pmaddwd(auVar82,auVar54);
              auVar53 = pmaddwd(auVar71,auVar54);
              auVar94 = ZEXT416((uint)-(int)(char)bVar4);
              auVar88._0_4_ = (auVar87._0_4_ >> 0xc) + iVar46 >> auVar94;
              auVar88._4_4_ = (auVar87._4_4_ >> 0xc) + iVar46 >> auVar94;
              auVar88._8_4_ = (auVar87._8_4_ >> 0xc) + iVar46 >> auVar94;
              auVar88._12_4_ = (auVar87._12_4_ >> 0xc) + iVar46 >> auVar94;
              auVar72._0_4_ = (auVar53._0_4_ >> 0xc) + iVar46 >> auVar94;
              auVar72._4_4_ = (auVar53._4_4_ >> 0xc) + iVar46 >> auVar94;
              auVar72._8_4_ = (auVar53._8_4_ >> 0xc) + iVar46 >> auVar94;
              auVar72._12_4_ = (auVar53._12_4_ >> 0xc) + iVar46 >> auVar94;
              auVar53 = packssdw(auVar88,auVar72);
              uVar2 = *puVar45;
              auVar16._8_6_ = 0;
              auVar16._0_8_ = uVar2;
              auVar16[0xe] = (char)(uVar2 >> 0x38);
              auVar17._8_4_ = 0;
              auVar17._0_8_ = uVar2;
              auVar17[0xc] = (char)(uVar2 >> 0x30);
              auVar17._13_2_ = auVar16._13_2_;
              auVar18._8_4_ = 0;
              auVar18._0_8_ = uVar2;
              auVar18._12_3_ = auVar17._12_3_;
              auVar19._8_2_ = 0;
              auVar19._0_8_ = uVar2;
              auVar19[10] = (char)(uVar2 >> 0x28);
              auVar19._11_4_ = auVar18._11_4_;
              auVar20._8_2_ = 0;
              auVar20._0_8_ = uVar2;
              auVar20._10_5_ = auVar19._10_5_;
              auVar21[8] = (char)(uVar2 >> 0x20);
              auVar21._0_8_ = uVar2;
              auVar21._9_6_ = auVar20._9_6_;
              auVar31._7_8_ = 0;
              auVar31._0_7_ = auVar21._8_7_;
              auVar32._1_8_ = SUB158(auVar31 << 0x40,7);
              auVar32[0] = (char)(uVar2 >> 0x18);
              auVar32._9_6_ = 0;
              auVar33._1_10_ = SUB1510(auVar32 << 0x30,5);
              auVar33[0] = (char)(uVar2 >> 0x10);
              auVar33._11_4_ = 0;
              auVar73._3_12_ = SUB1512(auVar33 << 0x20,3);
              auVar73[2] = (char)(uVar2 >> 8);
              auVar73[0] = (byte)uVar2;
              auVar73[1] = 0;
              auVar73[0xf] = 0;
              auVar53 = paddsw(auVar73,auVar53);
              sVar8 = auVar53._0_2_;
              sVar9 = auVar53._2_2_;
              sVar10 = auVar53._4_2_;
              sVar11 = auVar53._6_2_;
              sVar12 = auVar53._8_2_;
              sVar13 = auVar53._10_2_;
              sVar14 = auVar53._12_2_;
              sVar15 = auVar53._14_2_;
              *puVar45 = CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar53[0xe] - (0xff < sVar15),
                                  CONCAT16((0 < sVar14) * (sVar14 < 0x100) * auVar53[0xc] -
                                           (0xff < sVar14),
                                           CONCAT15((0 < sVar13) * (sVar13 < 0x100) * auVar53[10] -
                                                    (0xff < sVar13),
                                                    CONCAT14((0 < sVar12) * (sVar12 < 0x100) *
                                                             auVar53[8] - (0xff < sVar12),
                                                             CONCAT13((0 < sVar11) *
                                                                      (sVar11 < 0x100) * auVar53[6]
                                                                      - (0xff < sVar11),
                                                                      CONCAT12((0 < sVar10) *
                                                                               (sVar10 < 0x100) *
                                                                               auVar53[4] -
                                                                               (0xff < sVar10),
                                                                               CONCAT11((0 < sVar9)
                                                                                        * (sVar9 < 
                                                  0x100) * auVar53[2] - (0xff < sVar9),
                                                  (0 < sVar8) * (sVar8 < 0x100) * auVar53[0] -
                                                  (0xff < sVar8))))))));
              puVar45 = (ulong *)((long)puVar45 + (long)stride);
              lVar36 = lVar36 + 0x10;
            } while (lVar36 != 0x80);
            uVar41 = uVar41 + 1;
            puVar38 = puVar38 + 0x10;
          } while (uVar41 != uVar43);
        }
      }
      local_8c8 = local_8c8 + 1;
      local_8c0[0] = local_8c0[0] + 2;
    } while (local_8c8 != uVar40);
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_v_identity_ssse3(const int32_t *input,
                                               uint8_t *output, int stride,
                                               TX_TYPE tx_type, TX_SIZE tx_size,
                                               int eob) {
  __m128i buf1[64];
  int eobx, eoby;
  get_eobx_eoby_scan_v_identity(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = txfm_size_col >> 3;
  const int buf_size_nonzero_w = ((eobx + 8) >> 3) << 3;
  const int buf_size_h_div8 = (eoby + 8) >> 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx = lowbd_txfm_all_1d_zeros_idx[eobx];
  const transform_1d_ssse3 row_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][fun_idx];

  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_h_div8; i++) {
    __m128i buf0[64];
    load_buffer_32bit_to_16bit(input + i * 8, input_stride, buf0,
                               buf_size_nonzero_w);
    if (rect_type == 1 || rect_type == -1) {
      round_shift_ssse3(buf0, buf0, buf_size_nonzero_w);  // rect special code
    }
    row_txfm(buf0, buf0);
    round_shift_16bit_ssse3(buf0, txfm_size_col, shift[0]);
    __m128i *_buf1 = buf1;
    if (lr_flip) {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        __m128i temp[8];
        flip_buf_sse2(buf0 + 8 * j, temp, 8);
        transpose_16bit_8x8(temp, _buf1 + 8 * (buf_size_w_div8 - 1 - j));
      }
    } else {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        transpose_16bit_8x8(buf0 + 8 * j, _buf1 + 8 * j);
      }
    }

    for (int j = 0; j < buf_size_w_div8; ++j) {
      iidentity_col_8xn_ssse3(output + i * 8 * stride + j * 8, stride,
                              buf1 + j * 8, shift[1], 8, txh_idx);
    }
  }
}